

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_private.h
# Opt level: O0

int amqp_encode_64(amqp_bytes_t encoded,size_t *offset,uint64_t input)

{
  ulong uVar1;
  void *in_RCX;
  size_t *in_RDX;
  void *in_RSI;
  ulong in_RDI;
  size_t o;
  size_t offset_00;
  uint local_4;
  
  offset_00 = *in_RDX;
  uVar1 = offset_00 + 8;
  *in_RDX = uVar1;
  if (uVar1 <= in_RDI) {
    amqp_offset(in_RSI,offset_00);
    amqp_e64(offset_00,in_RCX);
  }
  local_4 = (uint)(uVar1 <= in_RDI);
  return local_4;
}

Assistant:

static inline int amqp_encode_bytes(amqp_bytes_t encoded, size_t *offset,
                                    amqp_bytes_t input) {
  size_t o = *offset;
  /* The memcpy below has undefined behavior if the input is NULL. It is valid
   * for a 0-length amqp_bytes_t to have .bytes == NULL. Thus we should check
   * before encoding.
   */
  if (input.len == 0) {
    return 1;
  }
  if ((*offset = o + input.len) <= encoded.len) {
    memcpy(amqp_offset(encoded.bytes, o), input.bytes, input.len);
    return 1;
  } else {
    return 0;
  }
}